

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

char * __thiscall
CVmObjTimeZone::cast_to_string(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *newstr)

{
  vm_obj_id_t obj;
  char *pcVar1;
  vm_val_t *in_RDX;
  char *name;
  size_t len;
  vm_val_t *in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  CVmTimeZone *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  
  get_tz((CVmObjTimeZone *)0x34ba3c);
  pcVar1 = CVmTimeZone::get_name(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  obj = CVmObjString::create(in_stack_ffffffffffffffe4,pcVar1,(size_t)in_RDX);
  vm_val_t::set_obj(in_RDX,obj);
  pcVar1 = vm_val_t::get_as_string(in_stack_ffffffffffffffc8);
  return pcVar1;
}

Assistant:

const char *CVmObjTimeZone::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *newstr) const
{
    /* get the time zone name */
    size_t len;
    const char *name = get_tz()->get_name(len);

    /* create the return string */
    newstr->set_obj(CVmObjString::create(vmg_ FALSE, name, len));
    return newstr->get_as_string(vmg0_);
}